

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitem.cpp
# Opt level: O2

QWidgetTextControl * __thiscall
QGraphicsTextItemPrivate::textControl(QGraphicsTextItemPrivate *this)

{
  QGraphicsTextItem *parent;
  QWidgetTextControl *pQVar1;
  QGraphicsTextItem *pQVar2;
  QGraphicsTextItemPrivate *pQVar3;
  qreal qVar4;
  QWidgetTextControl *this_00;
  undefined4 *puVar5;
  long in_FS_OFFSET;
  double in_XMM1_Qa;
  QSizeF QVar6;
  QRectF local_88;
  undefined1 local_60 [16];
  QObject local_50 [8];
  QObject local_48 [8];
  QObject local_40 [8];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->control == (QWidgetTextControl *)0x0) {
    parent = this->qq;
    this_00 = (QWidgetTextControl *)operator_new(0x18);
    QWidgetTextControl::QWidgetTextControl(this_00,(QObject *)parent);
    this->control = (QWidgetTextControl *)this_00;
    QWidgetTextControl::setTextInteractionFlags(this_00,(TextInteractionFlags)0x0);
    pQVar1 = this->control;
    pQVar2 = this->qq;
    pQVar3 = parent->dd;
    local_88.xp = (qreal)QWidgetTextControl::updateRequest;
    local_88.yp = 0.0;
    puVar5 = (undefined4 *)operator_new(0x18);
    *puVar5 = 1;
    *(code **)(puVar5 + 2) =
         QtPrivate::
         QCallableObject<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/widgets/graphicsview/qgraphicsitem.cpp:10306:26),_QtPrivate::List<const_QRectF_&>,_void>
         ::impl;
    *(QGraphicsTextItemPrivate **)(puVar5 + 4) = pQVar3;
    QObject::connectImpl
              (local_40,(void **)pQVar1,(QObject *)&local_88,(void **)pQVar2,(QSlotObjectBase *)0x0,
               (ConnectionType)puVar5,(int *)0x0,(QMetaObject *)0x0);
    QMetaObject::Connection::~Connection((Connection *)local_40);
    pQVar1 = this->control;
    pQVar2 = this->qq;
    pQVar3 = parent->dd;
    local_88.xp = (qreal)QWidgetTextControl::documentSizeChanged;
    local_88.yp = 0.0;
    puVar5 = (undefined4 *)operator_new(0x18);
    *puVar5 = 1;
    *(code **)(puVar5 + 2) =
         QtPrivate::
         QCallableObject<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/widgets/graphicsview/qgraphicsitem.cpp:10308:26),_QtPrivate::List<const_QSizeF_&>,_void>
         ::impl;
    *(QGraphicsTextItemPrivate **)(puVar5 + 4) = pQVar3;
    QObject::connectImpl
              (local_48,(void **)pQVar1,(QObject *)&local_88,(void **)pQVar2,(QSlotObjectBase *)0x0,
               (ConnectionType)puVar5,(int *)0x0,(QMetaObject *)0x0);
    QMetaObject::Connection::~Connection((Connection *)local_48);
    pQVar1 = this->control;
    pQVar2 = this->qq;
    pQVar3 = parent->dd;
    local_88.xp = (qreal)QWidgetTextControl::visibilityRequest;
    local_88.yp = 0.0;
    puVar5 = (undefined4 *)operator_new(0x18);
    *puVar5 = 1;
    *(code **)(puVar5 + 2) =
         QtPrivate::
         QCallableObject<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/widgets/graphicsview/qgraphicsitem.cpp:10310:26),_QtPrivate::List<const_QRectF_&>,_void>
         ::impl;
    *(QGraphicsTextItemPrivate **)(puVar5 + 4) = pQVar3;
    QObject::connectImpl
              (local_50,(void **)pQVar1,(QObject *)&local_88,(void **)pQVar2,(QSlotObjectBase *)0x0,
               (ConnectionType)puVar5,(int *)0x0,(QMetaObject *)0x0);
    QMetaObject::Connection::~Connection((Connection *)local_50);
    local_88.xp = (qreal)QGraphicsTextItem::linkActivated;
    local_88.yp = 0.0;
    QObject::
    connect<void(QWidgetTextControl::*)(QString_const&),void(QGraphicsTextItem::*)(QString_const&)>
              ((Object *)(local_60 + 8),(offset_in_QWidgetTextControl_to_subr)this->control,
               (ContextType *)QWidgetTextControl::linkActivated,
               (offset_in_QGraphicsTextItem_to_subr *)0x0,(ConnectionType)this->qq);
    QMetaObject::Connection::~Connection((Connection *)(local_60 + 8));
    local_88.xp = (qreal)QGraphicsTextItem::linkHovered;
    local_88.yp = 0.0;
    QObject::
    connect<void(QWidgetTextControl::*)(QString_const&),void(QGraphicsTextItem::*)(QString_const&)>
              ((Object *)local_60,(offset_in_QWidgetTextControl_to_subr)this->control,
               (ContextType *)QWidgetTextControl::linkHovered,
               (offset_in_QGraphicsTextItem_to_subr *)0x0,(ConnectionType)this->qq);
    QMetaObject::Connection::~Connection((Connection *)local_60);
    QWidgetTextControl::document((QWidgetTextControl *)this->control);
    qVar4 = (qreal)QTextDocument::pageSize();
    if ((in_XMM1_Qa != -1.0) || (NAN(in_XMM1_Qa))) {
      QGraphicsItem::prepareGeometryChange(&(this->qq->super_QGraphicsObject).super_QGraphicsItem);
      pQVar3 = parent->dd;
      (pQVar3->boundingRect).w = qVar4;
      (pQVar3->boundingRect).h = in_XMM1_Qa;
      local_88.w = 0.0;
      local_88.h = 0.0;
      local_88.xp = 0.0;
      local_88.yp = 0.0;
      QGraphicsItem::update(&(this->qq->super_QGraphicsObject).super_QGraphicsItem,&local_88);
    }
    else {
      pQVar3 = parent->dd;
      QVar6 = QWidgetTextControl::size((QWidgetTextControl *)this->control);
      local_88.yp = QVar6.ht;
      local_88.xp = QVar6.wd;
      _q_updateBoundingRect(pQVar3,(QSizeF *)&local_88);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return this->control;
  }
  __stack_chk_fail();
}

Assistant:

QWidgetTextControl *QGraphicsTextItemPrivate::textControl() const
{
    if (!control) {
        QGraphicsTextItem *that = const_cast<QGraphicsTextItem *>(qq);
        control = new QWidgetTextControl(that);
        control->setTextInteractionFlags(Qt::NoTextInteraction);

        QObject::connect(control, &QWidgetTextControl::updateRequest, qq,
                         [dd = that->dd](const QRectF &rect) { dd->_q_update(rect); });
        QObject::connect(control, &QWidgetTextControl::documentSizeChanged, qq,
                         [dd = that->dd](QSizeF size) { dd->_q_updateBoundingRect(size); });
        QObject::connect(control, &QWidgetTextControl::visibilityRequest, qq,
                         [dd = that->dd](const QRectF &rect) { dd->_q_ensureVisible(rect); });
        QObject::connect(control, &QWidgetTextControl::linkActivated, qq,
                         &QGraphicsTextItem::linkActivated);
        QObject::connect(control, &QWidgetTextControl::linkHovered, qq,
                         &QGraphicsTextItem::linkHovered);

        const QSizeF pgSize = control->document()->pageSize();
        if (pgSize.height() != -1) {
            qq->prepareGeometryChange();
            that->dd->boundingRect.setSize(pgSize);
            qq->update();
        } else {
            that->dd->_q_updateBoundingRect(control->size());
        }
    }
    return control;
}